

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_struct.cpp
# Opt level: O1

unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> __thiscall
duckdb::StructToUnionCast::BindData
          (StructToUnionCast *this,BindCastInput *input,LogicalType *source,LogicalType *target)

{
  __uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> _Var1;
  idx_t iVar2;
  LogicalType *source_00;
  LogicalType *target_00;
  StructBoundCastData *this_00;
  idx_t index;
  vector<duckdb::BoundCastInfo,_true> child_cast_info;
  BoundCastInfo child_cast;
  vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_> local_98;
  BoundCastInfo local_78;
  LogicalType *local_58;
  __uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> local_50;
  LogicalType local_48;
  
  local_98.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = target;
  local_50._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
  super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
       (tuple<duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
       (tuple<duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)this;
  iVar2 = StructType::GetChildCount(target);
  if (iVar2 != 0) {
    index = 0;
    do {
      source_00 = StructType::GetChildType(source,index);
      target_00 = StructType::GetChildType(local_58,index);
      BindCastInput::GetCastFunction(&local_78,input,source_00,target_00);
      ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::
      emplace_back<duckdb::BoundCastInfo>(&local_98,&local_78);
      if (local_78.cast_data.
          super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
          .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
           )0x0) {
        (*(*(_func_int ***)
            local_78.cast_data.
            super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
            .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl)[1])();
      }
      index = index + 1;
    } while (iVar2 != index);
  }
  this_00 = (StructBoundCastData *)operator_new(0x80);
  local_78.function =
       (cast_function_t)
       local_98.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_78.init_local_state =
       (init_cast_local_state_t)
       local_98.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_78.cast_data.
  super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
  super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
       (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
       local_98.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_48,local_58);
  StructBoundCastData::StructBoundCastData
            (this_00,(vector<duckdb::BoundCastInfo,_true> *)&local_78,&local_48);
  LogicalType::~LogicalType(&local_48);
  ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::~vector
            ((vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_> *)&local_78);
  _Var1._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
  super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
       local_50._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
       super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
  *(StructBoundCastData **)
   local_50._M_t.
   super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
   super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl = this_00;
  ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::~vector(&local_98);
  return (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
         _Var1._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
         .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BoundCastData> StructToUnionCast::BindData(BindCastInput &input, const LogicalType &source,
                                                      const LogicalType &target) {
	vector<BoundCastInfo> child_cast_info;
	D_ASSERT(source.id() == LogicalTypeId::STRUCT);
	D_ASSERT(target.id() == LogicalTypeId::UNION);

	auto result_child_count = StructType::GetChildCount(target);
	D_ASSERT(result_child_count == StructType::GetChildCount(source));

	for (idx_t i = 0; i < result_child_count; i++) {
		auto &source_child = StructType::GetChildType(source, i);
		auto &target_child = StructType::GetChildType(target, i);

		auto child_cast = input.GetCastFunction(source_child, target_child);
		child_cast_info.push_back(std::move(child_cast));
	}
	return make_uniq<StructBoundCastData>(std::move(child_cast_info), target);
}